

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O0

TestStatus *
vkt::synchronization::anon_unknown_0::hostResetSetEventCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkAllocationCallbacks **this;
  Deleter<vk::Handle<(vk::HandleType)10>_> deleter;
  RefData<vk::Handle<(vk::HandleType)10>_> data;
  int iVar1;
  DeviceInterface *deviceIface;
  VkDevice device_00;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  VkAllocationCallbacks *local_1d8;
  allocator<char> local_1c9;
  string local_1c8;
  VkAllocationCallbacks *local_1a8;
  allocator<char> local_199;
  string local_198;
  VkAllocationCallbacks *local_178;
  allocator<char> local_169;
  string local_168;
  VkAllocationCallbacks *local_148;
  allocator<char> local_139;
  string local_138;
  VkAllocationCallbacks *local_118;
  Deleter<vk::Handle<(vk::HandleType)10>_> local_110;
  VkAllocationCallbacks *local_f8;
  Handle<(vk::HandleType)10> local_f0;
  Move<vk::Handle<(vk::HandleType)10>_> local_e8;
  RefData<vk::Handle<(vk::HandleType)10>_> local_c8;
  undefined4 local_a8;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_70 [8];
  Move<vk::Handle<(vk::HandleType)10>_> ptrEvent;
  VkEvent event;
  VkEventCreateInfo eventInfo;
  VkDevice device;
  DeviceInterface *vk;
  Context *context_local;
  
  deviceIface = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  event.m_internal = 10;
  this = &ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator;
  ::vk::Handle<(vk::HandleType)10>::Handle((Handle<(vk::HandleType)10> *)this);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::Move
            ((Move<vk::Handle<(vk::HandleType)10>_> *)local_70);
  iVar1 = (*deviceIface->_vptr_DeviceInterface[0x19])(deviceIface,device_00,&event,0,this);
  if (iVar1 == 0) {
    local_f8 = ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator;
    local_f0.m_internal =
         (deUint64)
         ::vk::refdetails::check<vk::Handle<(vk::HandleType)10>>
                   ((Handle<(vk::HandleType)10>)
                    ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                    m_allocator);
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::Deleter
              (&local_110,deviceIface,device_00,(VkAllocationCallbacks *)0x0);
    deleter.m_device = local_110.m_device;
    deleter.m_deviceIface = local_110.m_deviceIface;
    deleter.m_allocator = local_110.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>>::Move<vk::Handle<(vk::HandleType)10>>
              ((Move<vk::Handle<(vk::HandleType)10>> *)&local_e8,
               (Checked<vk::Handle<(vk::HandleType)10>_>)local_f0.m_internal,deleter);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_c8,(Move *)&local_e8);
    data.deleter.m_deviceIface = local_c8.deleter.m_deviceIface;
    data.object.m_internal = local_c8.object.m_internal;
    data.deleter.m_device = local_c8.deleter.m_device;
    data.deleter.m_allocator = local_c8.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::operator=
              ((Move<vk::Handle<(vk::HandleType)10>_> *)local_70,data);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move(&local_e8);
    local_118 = ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator;
    iVar1 = (*deviceIface->_vptr_DeviceInterface[0x1b])
                      (deviceIface,device_00,
                       ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                       m_allocator);
    if (iVar1 == 4) {
      local_148 = ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator
      ;
      iVar1 = (*deviceIface->_vptr_DeviceInterface[0x1c])
                        (deviceIface,device_00,
                         ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                         m_allocator);
      if (iVar1 == 0) {
        local_178 = ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                    m_allocator;
        iVar1 = (*deviceIface->_vptr_DeviceInterface[0x1b])
                          (deviceIface,device_00,
                           ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                           m_allocator);
        if (iVar1 == 3) {
          local_1a8 = ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                      m_allocator;
          iVar1 = (*deviceIface->_vptr_DeviceInterface[0x1d])
                            (deviceIface,device_00,
                             ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                             m_allocator);
          if (iVar1 == 0) {
            local_1d8 = ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                        m_allocator;
            iVar1 = (*deviceIface->_vptr_DeviceInterface[0x1b])
                              (deviceIface,device_00,
                               ptrEvent.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.
                               deleter.m_allocator);
            if (iVar1 == 4) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_220,"Tests set and reset event on host pass",&local_221);
              tcu::TestStatus::pass(__return_storage_ptr__,&local_220);
              std::__cxx11::string::~string((string *)&local_220);
              std::allocator<char>::~allocator(&local_221);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1f8,"Event should be in unsignaled state after reset",
                         &local_1f9);
              tcu::TestStatus::fail(__return_storage_ptr__,&local_1f8);
              std::__cxx11::string::~string((string *)&local_1f8);
              std::allocator<char>::~allocator(&local_1f9);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1c8,"Couldn\'t reset event",&local_1c9);
            tcu::TestStatus::fail(__return_storage_ptr__,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::allocator<char>::~allocator(&local_1c9);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_198,"Event should be in signaled state after set",&local_199);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_198);
          std::__cxx11::string::~string((string *)&local_198);
          std::allocator<char>::~allocator(&local_199);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"Couldn\'t set event",&local_169);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator(&local_169);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"Created event should be in unsignaled state",&local_139);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Couldn\'t create event",&local_a1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  local_a8 = 1;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)10>_> *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus hostResetSetEventCase (Context& context)
{
	const DeviceInterface&		vk			= context.getDeviceInterface();
	const VkDevice				device		= context.getDevice();
	const VkEventCreateInfo		eventInfo	=
											{
												VK_STRUCTURE_TYPE_EVENT_CREATE_INFO,
												DE_NULL,
												0
											};
	VkEvent						event;
	Move<VkEvent>				ptrEvent;

	if (VK_SUCCESS != vk.createEvent(device, &eventInfo, DE_NULL, &event))
		return tcu::TestStatus::fail("Couldn't create event");

	ptrEvent = Move<VkEvent>(check<VkEvent>(event), Deleter<VkEvent>(vk, device, DE_NULL));

	if (VK_EVENT_RESET != vk.getEventStatus(device, event))
		return tcu::TestStatus::fail("Created event should be in unsignaled state");

	if (VK_SUCCESS != vk.setEvent(device, event))
		return tcu::TestStatus::fail("Couldn't set event");

	if (VK_EVENT_SET != vk.getEventStatus(device, event))
		return tcu::TestStatus::fail("Event should be in signaled state after set");

	if (VK_SUCCESS != vk.resetEvent(device, event))
		return tcu::TestStatus::fail("Couldn't reset event");

	if (VK_EVENT_RESET != vk.getEventStatus(device, event))
		return tcu::TestStatus::fail("Event should be in unsignaled state after reset");

	return tcu::TestStatus::pass("Tests set and reset event on host pass");
}